

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::RemoveInteractionsFromBPM_basic_Test::TestBody
          (RemoveInteractionsFromBPM_basic_Test *this)

{
  PolynomialValueList<double> *poly_value;
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  char *expected_predicate_value;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  initializer_list<unsigned_int> __l_16;
  initializer_list<unsigned_int> __l_17;
  initializer_list<unsigned_int> __l_18;
  initializer_list<unsigned_int> __l_19;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_20;
  initializer_list<unsigned_int> __l_21;
  initializer_list<unsigned_int> __l_22;
  initializer_list<unsigned_int> __l_23;
  initializer_list<unsigned_int> __l_24;
  initializer_list<unsigned_int> __l_25;
  initializer_list<unsigned_int> __l_26;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5a8;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_578;
  undefined1 local_55d;
  char local_55c;
  undefined1 local_55b;
  allocator_type local_55a;
  allocator_type local_559;
  allocator_type local_558;
  allocator_type local_557;
  allocator_type local_556;
  allocator_type local_555;
  allocator_type local_554;
  allocator_type local_553;
  allocator_type local_552;
  allocator_type local_551;
  allocator_type local_550;
  allocator_type local_54f;
  allocator_type local_54e;
  allocator_type local_54d;
  allocator_type local_54c;
  allocator_type local_54b;
  allocator_type local_54a;
  allocator_type local_549;
  undefined1 local_548 [48];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_518;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  PolynomialKeyList<uint32_t> removed_key_list;
  int local_498 [6];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_480;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_450;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_420;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_390;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  uint local_354 [12];
  undefined1 *local_324;
  uint local_31c [6];
  undefined1 *local_304;
  undefined4 local_2fc;
  undefined1 *local_2f8;
  undefined4 local_2f0;
  undefined1 *local_2ec;
  undefined4 local_2e4;
  Polynomial<uint32_t,_double> polynomial;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  undefined8 local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  undefined8 local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined8 local_110;
  pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  undefined8 local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined8 local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  undefined8 local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined8 local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  
  local_498[5] = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_498 + 5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l,&local_549);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bpm,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  bpm.variables_._M_h._M_element_count = 0x3ff0000000000000;
  local_498[4] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_498 + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removed_key_list,__l_00,
             &local_54a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_._M_h._M_rehash_policy,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removed_key_list);
  bpm.each_variable_num_._M_h._M_buckets = (__buckets_ptr)&DAT_4000000000000000;
  local_498[3] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)(local_498 + 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar,__l_01,&local_54b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.each_variable_num_._M_h._M_bucket_count,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar);
  bpm.each_variable_num_._M_h._M_rehash_policy._0_8_ = &DAT_4008000000000000;
  local_498[2] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)(local_498 + 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5a8,__l_02,&local_54c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.each_variable_num_._M_h._M_rehash_policy._M_next_resize,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5a8);
  bpm.variables_to_integers_._M_h._M_bucket_count = 0x4010000000000000;
  local_324 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_324;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_578,__l_03,&local_54d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_to_integers_._M_h._M_before_begin,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_578);
  bpm.variables_to_integers_._M_h._M_rehash_policy._M_next_resize = 0x4028000000000000;
  local_354[10] = 1;
  local_354[0xb] = 3;
  __l_04._M_len = 2;
  __l_04._M_array = local_354 + 10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8,__l_04,&local_54e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.variables_to_integers_._M_h._M_single_bucket,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8);
  bpm.sorted_variables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  local_354[8] = 1;
  local_354[9] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_354 + 8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0,__l_05,&local_54f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.relabel_flag_for_variables_to_integers_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0);
  bpm.poly_key_list_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x402c000000000000;
  local_354[6] = 2;
  local_354[7] = 3;
  __l_06._M_len = 2;
  __l_06._M_array = local_354 + 6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468,__l_06,&local_550);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bpm.poly_value_list_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468);
  bpm.poly_key_inv_._M_h._M_buckets = (__buckets_ptr)0x4037000000000000;
  local_354[4] = 2;
  local_354[5] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_354 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_480,__l_07,&local_551);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.poly_key_inv_._M_h._M_bucket_count,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_480);
  bpm.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  bpm.poly_key_inv_._M_h._M_rehash_policy._4_4_ = 0x40380000;
  local_354[2] = 3;
  local_354[3] = 4;
  __l_08._M_len = 2;
  __l_08._M_array = local_354 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390,__l_08,&local_552);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bpm.poly_key_inv_._M_h._M_rehash_policy._M_next_resize,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390);
  local_2ec = &DAT_c0000000b;
  local_2e4 = 0xe;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_2ec;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8,__l_09,&local_553);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_168,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8);
  local_150 = 0xbff0000000000000;
  local_498[1] = 7;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)(local_498 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0,__l_10,&local_554);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_148,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0);
  local_130 = 0xc000000000000000;
  local_354[0] = 2;
  local_354[1] = 0xb;
  __l_11._M_len = 2;
  __l_11._M_array = local_354;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8,__l_11,&local_555);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_128,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8);
  local_110 = 0xc022000000000000;
  local_378._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498[0] = -3;
  std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>::pair<int,_true>
            (&local_108,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_378,local_498)
  ;
  local_2f8 = &DAT_200000001;
  local_2f0 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_2f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f0,__l_12,&local_556);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f0);
  local_d0 = 0x405ec00000000000;
  local_304 = &DAT_200000001;
  local_2fc = 4;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&local_304;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408,__l_13,&local_557);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
  local_b0 = 0x405f000000000000;
  local_31c[3] = 1;
  local_31c[4] = 3;
  local_31c[5] = 4;
  __l_14._M_len = 3;
  __l_14._M_array = local_31c + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_420,__l_14,&local_558);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_420);
  local_90 = 0x4060c00000000000;
  local_31c[0] = 2;
  local_31c[1] = 3;
  local_31c[2] = 4;
  __l_15._M_len = 3;
  __l_15._M_array = local_31c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_438,__l_15,&local_559);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_88,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_438);
  local_70 = 0x406d400000000000;
  local_48 = &DAT_200000001;
  uStack_40 = 0x400000003;
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)&local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450,__l_16,&local_55a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450);
  local_50 = 0x4093480000000000;
  expected_predicate_value = &local_55c;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ((_Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&polynomial,&bpm,&local_48,0,&local_55b,expected_predicate_value,&local_55d);
  lVar5 = 0x240;
  do {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&bpm.variables_._M_h._M_buckets + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_450);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_438);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_420);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_408);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_378);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3c0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_390);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_480);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_468);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_578);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removed_key_list);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel(&bpm,&polynomial,SPIN);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0xe000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xc;
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)&gtest_ar;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_17,
             (allocator_type *)&local_4c8);
  local_578._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_578._M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_548 + 0x18),__l_18,
             (allocator_type *)&local_4e0);
  local_5a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x20000000b;
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)&local_5a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_518,__l_19,(allocator_type *)&local_468);
  local_500 = 0;
  uStack_4f8 = 0;
  local_4f0 = 0;
  __l_20._M_len = 4;
  __l_20._M_array = (iterator)local_548;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&removed_key_list,__l_20,(allocator_type *)&local_480);
  lVar5 = 0x48;
  do {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_548 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveInteractionsFrom(&bpm,&removed_key_list)
  ;
  local_548._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_548._8_8_ = (pointer)0x0;
  local_548._16_8_ = (pointer)0x0;
  dVar1 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (&bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"bpm.GetPolynomial({} )","0.0",dVar1,0.0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c6,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_548._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_5a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_5a8._M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_21._M_len = 1;
  __l_21._M_array = (iterator)&local_5a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_21,
             (allocator_type *)&local_578);
  dVar1 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (&bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"bpm.GetPolynomial({7} )","0.0",dVar1,0.0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_5a8._M_impl.super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)&local_5a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_22,
             (allocator_type *)&local_578);
  dVar1 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (&bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"bpm.GetPolynomial({2, 11} )","0.0",dVar1,0.0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_5a8._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_5a8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_23._M_len = 3;
  __l_23._M_array = (iterator)&local_5a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_23,
             (allocator_type *)&local_578);
  dVar1 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                    (&bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"bpm.GetPolynomial({11, 12, 14})","0.0",dVar1,0.0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_548._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_548._8_8_ = (pointer)0x0;
  local_548._16_8_ = (pointer)0x0;
  local_5a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                __count_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>>
                          ((__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )bpm.poly_key_list_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )bpm.poly_key_list_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  local_578._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_578._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{} )"
             ,"0",(long *)&local_5a8,(int *)&local_578);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_548._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar3 = bpm.poly_key_list_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = bpm.poly_key_list_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_578._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_578._M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_24._M_len = 1;
  __l_24._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_24,
             (allocator_type *)&local_4e0);
  local_5a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                __count_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>>
                          ((__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )pvVar2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     )pvVar3,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  local_4c8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7} )"
             ,"0",(long *)&local_5a8,(int *)&local_4c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar3 = bpm.poly_key_list_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = bpm.poly_key_list_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_578._M_impl.super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_25,
             (allocator_type *)&local_4e0);
  local_5a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                __count_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>>
                          ((__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )pvVar2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     )pvVar3,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  local_4c8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11} )"
             ,"0",(long *)&local_5a8,(int *)&local_4c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_5a8._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_5a8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_26._M_len = 3;
  __l_26._M_array = (iterator)&local_5a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_26,
             (allocator_type *)&local_4e0);
  local_578._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                __count_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>>
                          ((__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )bpm.poly_key_list_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            )bpm.poly_key_list_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  local_4c8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14})"
             ,"0",(long *)&local_578,(int *)&local_4c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3ce,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a8,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_548._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  poly_value = &bpm.poly_value_list_;
  bVar4 = EXPECT_CONTAIN(-3.0,poly_value);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = !bVar4;
  if (bVar4) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)&gtest_ar,
               (AssertionResult *)"EXPECT_CONTAIN(-3.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d0,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    std::__cxx11::string::~string((string *)local_548);
    if (local_5a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_5a8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar4 = EXPECT_CONTAIN(-2.0,poly_value);
  gtest_ar.success_ = !bVar4;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar.success_) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)&gtest_ar,
               (AssertionResult *)"EXPECT_CONTAIN(-2.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d1,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    std::__cxx11::string::~string((string *)local_548);
    if (local_5a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_5a8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar4 = EXPECT_CONTAIN(-9.0,poly_value);
  gtest_ar.success_ = !bVar4;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar.success_) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)&gtest_ar,
               (AssertionResult *)"EXPECT_CONTAIN(-9.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d2,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    std::__cxx11::string::~string((string *)local_548);
    if (local_5a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_5a8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar4 = EXPECT_CONTAIN(-1.0,poly_value);
  gtest_ar.success_ = !bVar4;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)&gtest_ar,
               (AssertionResult *)"EXPECT_CONTAIN(-1.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d3,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    std::__cxx11::string::~string((string *)local_548);
    if (local_5a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_5a8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  StateTestBPMUINT(&bpm);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&removed_key_list);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::~BinaryPolynomialModel(&bpm);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&polynomial._M_h);
  return;
}

Assistant:

TEST(RemoveInteractionsFromBPM, basic) {
   
   Polynomial<uint32_t, double> polynomial {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //To be removed
      {{11, 12, 14}, -1.0}, {{7}, -2.0}, {{2, 11}, -9.0}, {{}, -3},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   PolynomialKeyList<uint32_t> removed_key_list = {
      {11, 14, 12}, {7}, {11, 2}, {}
   };
   
   bpm.RemoveInteractionsFrom(removed_key_list);
      
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}          ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({7}         ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 11}     ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({11, 12, 14}), 0.0);
   
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{}          ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7}         ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11}     ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14}), 0);
   
   EXPECT_FALSE(EXPECT_CONTAIN(-3.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-2.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-9.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-1.0, bpm.GetValueList()));
   
   StateTestBPMUINT(bpm);
   
}